

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qstring.cpp
# Opt level: O1

qsizetype QtPrivate::lastIndexOf
                    (QLatin1StringView haystack,qsizetype from,QLatin1StringView needle,
                    CaseSensitivity cs)

{
  byte bVar1;
  bool bVar2;
  char32_t cVar3;
  int iVar4;
  long lVar5;
  char *pcVar6;
  long lVar7;
  char *pcVar8;
  char *ch;
  short sVar9;
  ushort uVar10;
  ushort uVar11;
  ulong uVar12;
  byte *pbVar13;
  ulong uVar14;
  long lVar15;
  ulong uVar16;
  long lVar17;
  QLatin1StringView rhs;
  QLatin1StringView lhs;
  
  pbVar13 = (byte *)needle.m_data;
  lVar15 = needle.m_size;
  pcVar6 = haystack.m_data;
  uVar12 = haystack.m_size;
  if (lVar15 != 1) {
    uVar16 = (from >> 0x3f & uVar12) + from;
    if (uVar16 == uVar12 && lVar15 == 0) {
      return uVar16;
    }
    uVar14 = uVar12 - lVar15;
    if ((long)uVar14 < 0 || uVar12 < uVar16) {
      return -1;
    }
    if ((long)uVar16 < (long)uVar14) {
      uVar14 = uVar16;
    }
    uVar12 = 0;
    if (lVar15 != 0) {
      uVar12 = lVar15 - 1;
    }
    if (cs != CaseSensitive) {
      pcVar8 = pcVar6;
      if (lVar15 < 1) {
        lVar5 = 0;
        lVar17 = 0;
      }
      else {
        lVar17 = 0;
        lVar5 = 0;
        lVar7 = lVar15;
        do {
          cVar3 = (anonymous_namespace)::foldCaseHelper<char_const*>
                            ((char *)(pbVar13 + (lVar7 - (ulong)(lVar15 != 0))),pcVar8);
          lVar17 = (ulong)(uint)cVar3 + lVar17 * 2;
          cVar3 = (anonymous_namespace)::foldCaseHelper<char_const*>
                            (pcVar6 + lVar7 + (uVar14 - (lVar15 != 0)),pcVar8);
          lVar5 = (ulong)(uint)cVar3 + lVar5 * 2;
          lVar7 = lVar7 + -1;
        } while (lVar7 != 0);
      }
      if ((long)uVar16 < 0) {
        return -1;
      }
      cVar3 = (anonymous_namespace)::foldCaseHelper<char_const*>(pcVar6 + uVar14,pcVar8);
      lVar5 = lVar5 - (ulong)(uint)cVar3;
      do {
        ch = pcVar6 + uVar14;
        cVar3 = (anonymous_namespace)::foldCaseHelper<char_const*>(ch,pcVar8);
        lVar5 = (ulong)(uint)cVar3 + lVar5;
        if ((lVar5 == lVar17) &&
           (lhs.m_data = ch, lhs.m_size = lVar15, iVar4 = compareStrings(lhs,needle,CaseInsensitive)
           , pcVar8 = ch, iVar4 == 0)) {
          return uVar14;
        }
        if (uVar12 < 0x40) {
          cVar3 = (anonymous_namespace)::foldCaseHelper<char_const*>
                            (pcVar6 + uVar14 + lVar15 + -1,pcVar8);
          lVar5 = lVar5 - ((ulong)(uint)cVar3 << ((byte)uVar12 & 0x3f));
        }
        lVar5 = lVar5 * 2;
        lVar7 = uVar14 - 1;
        uVar14 = uVar14 - 1;
      } while (pcVar6 <= pcVar6 + lVar7);
      return -1;
    }
    if (lVar15 < 1) {
      lVar5 = 0;
      lVar17 = 0;
    }
    else {
      lVar17 = 0;
      lVar5 = 0;
      lVar7 = lVar15;
      do {
        lVar17 = (ulong)pbVar13[lVar7 - (ulong)(lVar15 != 0)] + lVar17 * 2;
        lVar5 = (ulong)(byte)pcVar6[lVar7 + (uVar14 - (lVar15 != 0))] + lVar5 * 2;
        lVar7 = lVar7 + -1;
      } while (lVar7 != 0);
    }
    if ((long)uVar16 < 0) {
      return -1;
    }
    lVar5 = lVar5 - (ulong)(byte)pcVar6[uVar14];
    do {
      lVar5 = (ulong)(byte)pcVar6[uVar14] + lVar5;
      if ((lVar5 == lVar17) &&
         (rhs.m_data = pcVar6 + uVar14, rhs.m_size = lVar15,
         iVar4 = compareStrings(needle,rhs,CaseSensitive), iVar4 == 0)) {
        return uVar14;
      }
      if (uVar12 < 0x40) {
        lVar5 = lVar5 - ((ulong)(byte)pcVar6[uVar14 + lVar15 + -1] << ((byte)uVar12 & 0x3f));
      }
      lVar5 = lVar5 * 2;
      lVar7 = uVar14 - 1;
      uVar14 = uVar14 - 1;
    } while (pcVar6 <= pcVar6 + lVar7);
    return -1;
  }
  if (uVar12 == 0) {
    return -1;
  }
  lVar15 = uVar12 - 1;
  if ((ulong)from <= uVar12) {
    lVar15 = from;
  }
  if (from < 0) {
    lVar15 = from + uVar12;
  }
  if (lVar15 < 0) {
    return -1;
  }
  bVar1 = *pbVar13;
  uVar10 = (ushort)bVar1;
  if (cs == CaseSensitive) {
    do {
      if (pcVar6[lVar15] == bVar1) goto LAB_0033a567;
      lVar17 = lVar15 + -1;
      lVar15 = lVar15 + -1;
    } while (pcVar6 <= pcVar6 + lVar17);
  }
  else {
    sVar9 = (short)((uint)(int)(short)*(ushort *)
                                       (QUnicodeTables::uc_properties +
                                       (ulong)*(ushort *)
                                               (QUnicodeTables::uc_property_trie +
                                               (ulong)(((ushort)bVar1 & 0x1f) +
                                                      (uint)*(ushort *)
                                                             (QUnicodeTables::uc_property_trie +
                                                             (ulong)(bVar1 >> 5) * 2)) * 2) * 0x14 +
                                       0xe) >> 1);
    if ((*(ushort *)
          (QUnicodeTables::uc_properties +
          (ulong)*(ushort *)
                  (QUnicodeTables::uc_property_trie +
                  (ulong)(((ushort)bVar1 & 0x1f) +
                         (uint)*(ushort *)
                                (QUnicodeTables::uc_property_trie + (ulong)(bVar1 >> 5) * 2)) * 2) *
          0x14 + 0xe) & 1) == 0) {
      uVar10 = sVar9 + (ushort)bVar1;
    }
    else if (*(short *)(QUnicodeTables::specialCaseMap + (long)sVar9 * 2) == 1) {
      uVar10 = *(ushort *)(QUnicodeTables::specialCaseMap + (long)sVar9 * 2 + 2);
    }
    do {
      bVar1 = pcVar6[lVar15];
      uVar11 = (ushort)bVar1;
      sVar9 = (short)((uint)(int)(short)*(ushort *)
                                         (QUnicodeTables::uc_properties +
                                         (ulong)*(ushort *)
                                                 (QUnicodeTables::uc_property_trie +
                                                 (ulong)((bVar1 & 0x1f) +
                                                        (uint)*(ushort *)
                                                               (QUnicodeTables::uc_property_trie +
                                                               (ulong)(bVar1 >> 5) * 2)) * 2) * 0x14
                                         + 0xe) >> 1);
      if ((*(ushort *)
            (QUnicodeTables::uc_properties +
            (ulong)*(ushort *)
                    (QUnicodeTables::uc_property_trie +
                    (ulong)((bVar1 & 0x1f) +
                           (uint)*(ushort *)
                                  (QUnicodeTables::uc_property_trie + (ulong)(bVar1 >> 5) * 2)) * 2)
            * 0x14 + 0xe) & 1) == 0) {
        uVar11 = (ushort)bVar1 + sVar9;
      }
      else if (*(short *)(QUnicodeTables::specialCaseMap + (long)sVar9 * 2) == 1) {
        uVar11 = *(ushort *)(QUnicodeTables::specialCaseMap + (long)sVar9 * 2 + 2);
      }
      if (uVar11 == uVar10) goto LAB_0033a567;
      lVar17 = lVar15 + -1;
      lVar15 = lVar15 + -1;
    } while (pcVar6 <= pcVar6 + lVar17);
  }
  bVar2 = true;
LAB_0033a569:
  if (bVar2) {
    return -1;
  }
  return lVar15;
LAB_0033a567:
  bVar2 = false;
  goto LAB_0033a569;
}

Assistant:

qsizetype QtPrivate::lastIndexOf(QLatin1StringView haystack, qsizetype from, QLatin1StringView needle, Qt::CaseSensitivity cs) noexcept
{
    return qLastIndexOf(haystack, from, needle, cs);
}